

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O1

ImporterPtr __thiscall libcellml::Importer::create(Importer *this,bool strict)

{
  Importer *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ImporterPtr IVar1;
  
  this_00 = (Importer *)operator_new(0x20);
  Importer(this_00);
  (this->super_Logger)._vptr_Logger = (_func_int **)this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<libcellml::Importer*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(this->super_Logger).mPimpl,this_00);
  Strict::setStrict((Strict *)((this->super_Logger)._vptr_Logger + 2),strict);
  IVar1.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  IVar1.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (ImporterPtr)IVar1.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ImporterPtr Importer::create(bool strict) noexcept
{
    auto importer = std::shared_ptr<Importer> {new Importer {}};
    importer->setStrict(strict);
    return importer;
}